

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

void compactor_get_virtual_filename(char *filename,char *virtual_filename)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  
  sVar2 = strlen(filename);
  uVar3 = sVar2 & 0xffffffff;
  iVar4 = (int)sVar2 + 1;
  do {
    if ((int)uVar3 < 1) {
      iVar4 = 0;
      break;
    }
    iVar4 = iVar4 + -1;
    lVar1 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (filename[lVar1] != '.');
  if (iVar4 < 2) {
    strcpy(virtual_filename,filename);
    return;
  }
  strncpy(virtual_filename,filename,(ulong)(iVar4 - 1));
  virtual_filename[iVar4 - 1] = '\0';
  return;
}

Assistant:

void compactor_get_virtual_filename(const char *filename,
                                    char *virtual_filename)
{
    int prefix_len = _compactor_prefix_len((char*)filename) - 1;
    if (prefix_len > 0) {
        strncpy(virtual_filename, filename, prefix_len);
        virtual_filename[prefix_len] = 0;
    } else {
        strcpy(virtual_filename, filename);
    }
}